

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O1

void sb_bmp_append_doc(fdb_kvs_handle *handle)

{
  undefined8 *puVar1;
  superblock *psVar2;
  ulong uVar3;
  uint uVar4;
  bid_t *pbVar5;
  docio_object *pdVar6;
  size_t sVar7;
  bid_t bVar8;
  long lVar9;
  ulong __nmemb;
  long lVar10;
  ulong uVar11;
  char doc_key [64];
  char local_78 [72];
  
  psVar2 = handle->file->sb;
  if (psVar2->bmp_doc_offset != (bid_t *)0x0) {
    if (psVar2->num_bmp_docs != 0) {
      lVar9 = 1;
      uVar11 = 0;
      do {
        uVar4 = *(uint *)((long)psVar2->bmp_docs + lVar9 * 8 + -8);
        filemgr_mark_stale(handle->file,psVar2->bmp_doc_offset[uVar11],
                           (ulong)((uVar4 & 0xffff) + (uVar4 >> 0x10) +
                                  *(int *)(&(psVar2->bmp_docs->length).keylen + lVar9 * 4)) + 0x20);
        uVar11 = uVar11 + 1;
        lVar9 = lVar9 + 7;
      } while (uVar11 < psVar2->num_bmp_docs);
    }
    free(psVar2->bmp_doc_offset);
    free(psVar2->bmp_docs);
    psVar2->bmp_doc_offset = (bid_t *)0x0;
    psVar2->bmp_docs = (docio_object *)0x0;
  }
  uVar3 = (psVar2->bmp_size).super___atomic_base<unsigned_long>._M_i;
  uVar11 = uVar3 + 0x7fffff;
  __nmemb = uVar11 >> 0x17;
  psVar2->num_bmp_docs = __nmemb;
  if (0x7fffff < uVar11) {
    pbVar5 = (bid_t *)calloc(__nmemb,8);
    psVar2->bmp_doc_offset = pbVar5;
    pdVar6 = (docio_object *)calloc(__nmemb,0x38);
    psVar2->bmp_docs = pdVar6;
    lVar9 = 0;
    lVar10 = 0;
    uVar11 = 0;
    do {
      pdVar6 = psVar2->bmp_docs;
      *(undefined8 *)((long)&pdVar6->body + lVar10) = 0;
      puVar1 = (undefined8 *)((long)&pdVar6->field_3 + lVar10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&pdVar6->timestamp + lVar10);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&(pdVar6->length).keylen + lVar10);
      *puVar1 = 0;
      puVar1[1] = 0;
      sprintf(local_78,"bitmap_%lu_%d",(psVar2->bmp_revnum).super___atomic_base<unsigned_long>._M_i,
              uVar11 & 0xffffffff);
      pdVar6 = psVar2->bmp_docs;
      *(char **)((long)&pdVar6->key + lVar10) = local_78;
      *(undefined8 *)((long)&pdVar6->meta + lVar10) = 0;
      pdVar6 = psVar2->bmp_docs;
      *(__pointer_type *)((long)&pdVar6->body + lVar10) = (psVar2->bmp)._M_b._M_p + lVar9;
      sVar7 = strlen(local_78);
      *(short *)((long)&(pdVar6->length).keylen + lVar10) = (short)sVar7 + 1;
      *(undefined2 *)((long)&(pdVar6->length).metalen + lVar10) = 0;
      uVar4 = 0x100000;
      if (__nmemb * 0x38 + -0x38 == lVar10) {
        uVar4 = (uint)(uVar3 >> 3) & 0xfffff;
      }
      *(uint *)((long)&(pdVar6->length).bodylen + lVar10) = uVar4;
      *(undefined8 *)((long)&pdVar6->field_3 + lVar10) = 0;
      bVar8 = docio_append_doc_system
                        (handle->dhandle,
                         (docio_object *)((long)&(psVar2->bmp_docs->length).keylen + lVar10));
      psVar2->bmp_doc_offset[uVar11] = bVar8;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 0x38;
      lVar9 = lVar9 + 0x100000;
    } while (__nmemb * 0x38 != lVar10);
  }
  return;
}

Assistant:

void sb_bmp_append_doc(fdb_kvs_handle *handle)
{
    // == write bitmap into system docs ==
    // calculate # docs (1MB by default)
    // (1MB bitmap covers 32GB DB file)
    size_t i;
    uint64_t num_docs;
    char doc_key[64];
    struct superblock *sb = handle->file->sb;

    // mark stale if previous doc offset exists
    if (sb->bmp_doc_offset) {
        for (i=0; i<sb->num_bmp_docs; ++i) {
            filemgr_mark_stale(handle->file, sb->bmp_doc_offset[i],
                _fdb_get_docsize(sb->bmp_docs[i].length));
        }

        free(sb->bmp_doc_offset);
        free(sb->bmp_docs);
        sb->bmp_doc_offset = NULL;
        sb->bmp_docs = NULL;
    }

    uint64_t sb_bmp_size = atomic_get_uint64_t(&sb->bmp_size);
    sb->num_bmp_docs = num_docs = _bmp_size_to_num_docs(sb_bmp_size);
    if (num_docs) {
        sb->bmp_doc_offset = (bid_t*)calloc(num_docs, sizeof(bid_t));
        sb->bmp_docs = (struct docio_object*)
                       calloc(num_docs, sizeof(struct docio_object));
    }

    // bitmap doc offsets
    for (i=0; i<num_docs; ++i) {
        // append a system doc for bitmap chunk
        memset(&sb->bmp_docs[i], 0x0, sizeof(struct docio_object));
        sprintf(doc_key, "bitmap_%" _F64 "_%d",
                atomic_get_uint64_t(&sb->bmp_revnum), (int)i);
        sb->bmp_docs[i].key = (void*)doc_key;
        sb->bmp_docs[i].meta = NULL;
        sb->bmp_docs[i].body = sb->bmp + (i * SB_MAX_BITMAP_DOC_SIZE);

        sb->bmp_docs[i].length.keylen = strlen(doc_key)+1;
        sb->bmp_docs[i].length.metalen = 0;
        if (i == num_docs - 1) {
            // the last doc
            sb->bmp_docs[i].length.bodylen =
                (sb_bmp_size / 8) % SB_MAX_BITMAP_DOC_SIZE;
        } else {
            // otherwise: 1MB
            sb->bmp_docs[i].length.bodylen = SB_MAX_BITMAP_DOC_SIZE;
        }
        sb->bmp_docs[i].seqnum = 0;
        sb->bmp_doc_offset[i] =
            docio_append_doc_system(handle->dhandle, &sb->bmp_docs[i]);
    }
}